

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satProof.c
# Opt level: O0

void Proof_CollectUsed_rec(Vec_Set_t *vProof,int hNode,Vec_Int_t *vUsed)

{
  bool bVar1;
  satset *psVar2;
  satset *local_40;
  int local_34;
  int i;
  satset *pNode;
  satset *pNext;
  Vec_Int_t *vUsed_local;
  int hNode_local;
  Vec_Set_t *vProof_local;
  
  psVar2 = Proof_NodeRead(vProof,hNode);
  if (psVar2->Id == 0) {
    psVar2->Id = 1;
    local_34 = 0;
    while( true ) {
      bVar1 = false;
      if (local_34 < (int)(*(uint *)psVar2 >> 3)) {
        if ((*(uint *)(&psVar2[1].field_0x0 + (long)local_34 * 4) & 1) == 0) {
          local_40 = Proof_NodeRead(vProof,*(int *)(&psVar2[1].field_0x0 + (long)local_34 * 4) >> 2)
          ;
        }
        else {
          local_40 = (satset *)0x0;
        }
        pNode = local_40;
        bVar1 = true;
      }
      if (!bVar1) break;
      if ((pNode != (satset *)0x0) && (pNode->Id == 0)) {
        Proof_CollectUsed_rec(vProof,*(int *)(&psVar2[1].field_0x0 + (long)local_34 * 4) >> 2,vUsed)
        ;
      }
      local_34 = local_34 + 1;
    }
    Vec_IntPush(vUsed,hNode);
  }
  return;
}

Assistant:

void Proof_CollectUsed_rec( Vec_Set_t * vProof, int hNode, Vec_Int_t * vUsed )
{
    satset * pNext, * pNode = Proof_NodeRead( vProof, hNode );
    int i;
    if ( pNode->Id )
        return;
    pNode->Id = 1;
    Proof_NodeForeachFanin( vProof, pNode, pNext, i )
        if ( pNext && !pNext->Id )
            Proof_CollectUsed_rec( vProof, pNode->pEnts[i] >> 2, vUsed );
    Vec_IntPush( vUsed, hNode );
}